

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

BOOL CreateDirectoryW(LPCWSTR lpPathName,LPSECURITY_ATTRIBUTES lpSecurityAttributes)

{
  FILE *pFVar1;
  int cbMultiByte;
  int iVar2;
  BOOL BVar3;
  DWORD DVar4;
  LPCSTR lpMultiByteStr;
  uint *puVar5;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0031d87a;
  if (lpSecurityAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    cbMultiByte = WideCharToMultiByte(0,0,lpPathName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
    if (cbMultiByte == 0) {
      lpMultiByteStr = (LPCSTR)0x0;
      fprintf(_stderr,"] %s %s:%d","CreateDirectoryW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
              ,0x4d);
      pFVar1 = _stderr;
      DVar4 = GetLastError();
      fprintf(pFVar1,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar4);
LAB_0031d849:
      DVar4 = 0x54f;
      goto LAB_0031d84e;
    }
    lpMultiByteStr = (LPCSTR)PAL_malloc((long)cbMultiByte);
    if (lpMultiByteStr == (LPCSTR)0x0) {
LAB_0031d7b0:
      fprintf(_stderr,"] %s %s:%d","CreateDirectoryW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
              ,0x57);
      pFVar1 = _stderr;
      DVar4 = GetLastError();
      puVar5 = (uint *)__errno_location();
      fprintf(pFVar1,"WideCharToMultiByte or PAL_malloc failure! LastError:%d errno:%d\n",
              (ulong)DVar4,(ulong)*puVar5);
      goto LAB_0031d849;
    }
    iVar2 = WideCharToMultiByte(0,0,lpPathName,-1,lpMultiByteStr,cbMultiByte,(LPCSTR)0x0,(LPBOOL)0x0
                               );
    if (iVar2 != cbMultiByte) goto LAB_0031d7b0;
    BVar3 = CreateDirectoryA(lpMultiByteStr,(LPSECURITY_ATTRIBUTES)0x0);
LAB_0031d85b:
    PAL_free(lpMultiByteStr);
  }
  else {
    lpMultiByteStr = (LPCSTR)0x0;
    fprintf(_stderr,"] %s %s:%d","CreateDirectoryW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
            ,0x44);
    fprintf(_stderr,"lpSecurityAttributes is not NULL as it should be\n");
    DVar4 = 0x57;
LAB_0031d84e:
    SetLastError(DVar4);
    BVar3 = 0;
    if (lpMultiByteStr != (LPCSTR)0x0) goto LAB_0031d85b;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar3;
  }
LAB_0031d87a:
  abort();
}

Assistant:

BOOL
PALAPI
CreateDirectoryW(
         IN LPCWSTR lpPathName,
         IN LPSECURITY_ATTRIBUTES lpSecurityAttributes)
{
    BOOL  bRet = FALSE;
    DWORD dwLastError = 0;
    int   mb_size;
    char  *mb_dir = NULL;

    PERF_ENTRY(CreateDirectoryW);
    ENTRY("CreateDirectoryW(lpPathName=%p (%S), lpSecurityAttr=%p)\n",
          lpPathName?lpPathName:W16_NULLSTRING,
          lpPathName?lpPathName:W16_NULLSTRING, lpSecurityAttributes);

    if ( lpSecurityAttributes )
    {
        ASSERT("lpSecurityAttributes is not NULL as it should be\n");
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    /* translate the wide char lpPathName string to multibyte string */
    if(0 == (mb_size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, NULL, 0,
                                            NULL, NULL )))
    {
        ASSERT("WideCharToMultiByte failure! error is %d\n", GetLastError());
        dwLastError = ERROR_INTERNAL_ERROR;
        goto done;
    }

    if (((mb_dir = (char *)PAL_malloc(mb_size)) == NULL) ||
        (WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, mb_dir, mb_size, NULL,
                              NULL) != mb_size))
    {
        ASSERT("WideCharToMultiByte or PAL_malloc failure! LastError:%d errno:%d\n",
              GetLastError(), errno);
        dwLastError = ERROR_INTERNAL_ERROR;
        goto done;
    }

    bRet = CreateDirectoryA(mb_dir,NULL);
done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }
    if (mb_dir != NULL)
    {
        PAL_free(mb_dir);
    }
    LOGEXIT("CreateDirectoryW returns BOOL %d\n", bRet);
    PERF_EXIT(CreateDirectoryW);
    return bRet;
}